

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_print.c
# Opt level: O0

void h262_print_picparm(h262_picparm *picparm)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint *in_RDI;
  char *ps;
  int j;
  int i;
  char *pctstr;
  int b;
  int f;
  char *local_28;
  uint local_20;
  uint local_1c;
  char *local_18;
  
  bVar2 = false;
  bVar3 = false;
  local_18 = "???";
  printf("Picture header:\n");
  printf("\ttemporal_reference = %d\n",(ulong)*in_RDI);
  switch(in_RDI[1]) {
  case 1:
    local_18 = "I";
    break;
  case 2:
    local_18 = "P";
    bVar2 = true;
    break;
  case 3:
    local_18 = "B";
    bVar3 = true;
    bVar2 = true;
    break;
  case 4:
    local_18 = "D";
  }
  printf("\tpicture_coding_type = %d [%s]\n",(ulong)in_RDI[1],local_18);
  printf("\tvbv_delay = %d\n",(ulong)in_RDI[2]);
  if (bVar2) {
    printf("\tfull_pel_forward_vector = %d\n",(ulong)in_RDI[3]);
    printf("\tforward_f_code = %d\n",(ulong)in_RDI[4]);
  }
  if (bVar3) {
    printf("\tfull_pel_backward_vector = %d\n",(ulong)in_RDI[5]);
    printf("\tbackward_f_code = %d\n",(ulong)in_RDI[6]);
  }
  if (in_RDI[7] != 0) {
    for (local_1c = 0; (int)local_1c < 2; local_1c = local_1c + 1) {
      for (local_20 = 0; (int)local_20 < 2; local_20 = local_20 + 1) {
        printf("\tf_code[%d][%d] = %d\n",(ulong)local_1c,(ulong)local_20,
               (ulong)in_RDI[(long)(int)local_1c * 2 + (long)(int)local_20 + 8]);
      }
    }
    printf("\tintra_dc_precision = %d\n",(ulong)in_RDI[0xc]);
    local_28 = "???";
    uVar1 = in_RDI[0xd];
    if (uVar1 == 1) {
      local_28 = "top field";
    }
    else if (uVar1 == 2) {
      local_28 = "bottom field";
    }
    else if (uVar1 == 3) {
      local_28 = "frame";
    }
    printf("\tpicture_structure = %d [%s]\n",(ulong)in_RDI[0xd],local_28);
    printf("\ttop_field_first = %d\n",(ulong)in_RDI[0xe]);
    printf("\tframe_pred_frame_dct = %d\n",(ulong)in_RDI[0xf]);
    printf("\tconcealment_motion_vectors = %d\n",(ulong)in_RDI[0x10]);
    printf("\tq_scale_type = %d\n",(ulong)in_RDI[0x11]);
    printf("\tintra_vlc_format = %d\n",(ulong)in_RDI[0x12]);
    printf("\talternate_scan = %d\n",(ulong)in_RDI[0x13]);
    printf("\trepeat_first_field = %d\n",(ulong)in_RDI[0x14]);
    printf("\tchroma_420_type = %d\n",(ulong)in_RDI[0x15]);
    printf("\tprogressive_frame = %d\n",(ulong)in_RDI[0x16]);
    printf("\tcomposite_display_flag = %d\n",(ulong)in_RDI[0x17]);
    if (in_RDI[0x17] != 0) {
      printf("\tv_axis = %d\n",(ulong)in_RDI[0x18]);
      printf("\tfield_sequence = %d\n",(ulong)in_RDI[0x19]);
      printf("\tsub_carrier = %d\n",(ulong)in_RDI[0x1a]);
      printf("\tburst_amplitude = %d\n",(ulong)in_RDI[0x1b]);
      printf("\tsub_carrier_phase = %d\n",(ulong)in_RDI[0x1c]);
    }
  }
  return;
}

Assistant:

void h262_print_picparm(struct h262_picparm *picparm) {
	int f = 0, b = 0;
	const char *pctstr = "???";
	printf("Picture header:\n");
	printf("\ttemporal_reference = %d\n", picparm->temporal_reference);
	switch (picparm->picture_coding_type) {
		case H262_PIC_TYPE_I:
			pctstr = "I";
			break;
		case H262_PIC_TYPE_P:
			pctstr = "P";
			f = 1;
			break;
		case H262_PIC_TYPE_B:
			pctstr = "B";
			f = b = 1;
			break;
		case H262_PIC_TYPE_D:
			pctstr = "D";
			break;
	}
	printf("\tpicture_coding_type = %d [%s]\n", picparm->picture_coding_type, pctstr);
	printf("\tvbv_delay = %d\n", picparm->vbv_delay);
	if (f) {
		printf("\tfull_pel_forward_vector = %d\n", picparm->full_pel_forward_vector);
		printf("\tforward_f_code = %d\n", picparm->forward_f_code);
	}
	if (b) {
		printf("\tfull_pel_backward_vector = %d\n", picparm->full_pel_backward_vector);
		printf("\tbackward_f_code = %d\n", picparm->backward_f_code);
	}
	if (picparm->is_ext) {
		int i, j;
		for (i = 0; i < 2; i++)
			for (j = 0; j < 2; j++)
				printf("\tf_code[%d][%d] = %d\n", i, j, picparm->f_code[i][j]);
		printf("\tintra_dc_precision = %d\n", picparm->intra_dc_precision);
		const char *ps = "???";
		switch (picparm->picture_structure) {
			case H262_PIC_STRUCT_FIELD_TOP:
				ps = "top field";
				break;
			case H262_PIC_STRUCT_FIELD_BOTTOM:
				ps = "bottom field";
				break;
			case H262_PIC_STRUCT_FRAME:
				ps = "frame";
				break;
		}
		printf("\tpicture_structure = %d [%s]\n", picparm->picture_structure, ps);
		printf("\ttop_field_first = %d\n", picparm->top_field_first);
		printf("\tframe_pred_frame_dct = %d\n", picparm->frame_pred_frame_dct);
		printf("\tconcealment_motion_vectors = %d\n", picparm->concealment_motion_vectors);
		printf("\tq_scale_type = %d\n", picparm->q_scale_type);
		printf("\tintra_vlc_format = %d\n", picparm->intra_vlc_format);
		printf("\talternate_scan = %d\n", picparm->alternate_scan);
		printf("\trepeat_first_field = %d\n", picparm->repeat_first_field);
		printf("\tchroma_420_type = %d\n", picparm->chroma_420_type);
		printf("\tprogressive_frame = %d\n", picparm->progressive_frame);
		printf("\tcomposite_display_flag = %d\n", picparm->composite_display_flag);
		if (picparm->composite_display_flag) {
			printf("\tv_axis = %d\n", picparm->v_axis);
			printf("\tfield_sequence = %d\n", picparm->field_sequence);
			printf("\tsub_carrier = %d\n", picparm->sub_carrier);
			printf("\tburst_amplitude = %d\n", picparm->burst_amplitude);
			printf("\tsub_carrier_phase = %d\n", picparm->sub_carrier_phase);
		}
	}
}